

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O0

bool __thiscall ON_Object::SetUserString(ON_Object *this,wchar_t *key,wchar_t *string_value)

{
  bool bVar1;
  bool bVar2;
  ON_UserStringList *pOStack_28;
  bool b;
  ON_UserStringList *us;
  wchar_t *string_value_local;
  wchar_t *key_local;
  ON_Object *this_local;
  
  pOStack_28 = ON_UserStringList::FromObject(this);
  bVar1 = false;
  if (pOStack_28 == (ON_UserStringList *)0x0) {
    pOStack_28 = (ON_UserStringList *)operator_new(0xe0);
    ON_UserStringList::ON_UserStringList(pOStack_28);
    bVar2 = AttachUserData(this,(ON_UserData *)pOStack_28);
    if (bVar2) {
      bVar1 = true;
    }
    else {
      if (pOStack_28 != (ON_UserStringList *)0x0) {
        (*(pOStack_28->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])();
      }
      pOStack_28 = (ON_UserStringList *)0x0;
    }
  }
  if (pOStack_28 != (ON_UserStringList *)0x0) {
    bVar2 = ON_UserStringList::SetUserString(pOStack_28,key,string_value);
    if (bVar2) {
      if ((bVar1 != false) && ((pOStack_28->super_ON_UserData).m_userdata_copycount == 2)) {
        (pOStack_28->super_ON_UserData).m_userdata_copycount = 1;
      }
      bVar1 = true;
    }
    else if (bVar1 != false) {
      if (pOStack_28 != (ON_UserStringList *)0x0) {
        (*(pOStack_28->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])();
      }
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ON_Object::SetUserString( const wchar_t* key, const wchar_t* string_value )
{
  ON_UserStringList* us = ON_UserStringList::FromObject(this);

  bool b = false;
  if ( nullptr == us )
  {
    us = new ON_UserStringList();
    if ( !AttachUserData(us) )
    {
      delete us;
      us = nullptr;
    }
    else
    {
      b = true;
    }
  }

  if ( us )
  {
    if ( us->SetUserString(key,string_value) )
    {
      if ( b && 2 == us->m_userdata_copycount )
      {
        // user data is brand new - roll back the 
        // m_userdata_copycount++ that happens in 
        // SetUserString().
        us->m_userdata_copycount = 1;
      }
      b = true;
    }
    else if ( b )
    {
      // user data was new-ed up and has nothing in it
      // because the input was bogus.
      delete us;
      us = nullptr;
      b = false;
    }
  }
  return b;
}